

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall google::protobuf::Message::CheckInitialized(Message *this)

{
  char *pcVar1;
  bool bVar2;
  LogMessage *this_00;
  Metadata MVar3;
  string_view str;
  string_view v;
  string_view str_00;
  LogMessage local_40;
  string local_30;
  
  bVar2 = MessageLite::IsInitialized(&this->super_MessageLite);
  if (bVar2) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
             ,0x92,"IsInitialized()");
  str._M_str = "Message of type \"";
  str._M_len = 0x11;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_40,str);
  MVar3 = GetMetadata(this);
  pcVar1 = ((MVar3.descriptor)->all_names_).payload_;
  v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
  v._M_str = pcVar1 + ~v._M_len;
  this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,v);
  str_00._M_str = "\" is missing required fields: ";
  str_00._M_len = 0x1e;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_00,str_00);
  InitializationErrorString_abi_cxx11_(&local_30,this);
  absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

void Message::CheckInitialized() const {
  ABSL_CHECK(IsInitialized())
      << "Message of type \"" << GetDescriptor()->full_name()
      << "\" is missing required fields: " << InitializationErrorString();
}